

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int consume_one_frame(amqp_connection_state_t state,amqp_frame_t *decoded_frame)

{
  amqp_bytes_t received_data;
  long in_RDI;
  amqp_bytes_t buffer;
  amqp_connection_state_t in_stack_00000018;
  int res;
  undefined4 local_4;
  
  received_data.bytes = state;
  received_data.len = (size_t)decoded_frame;
  local_4 = amqp_handle_input(in_stack_00000018,received_data,(amqp_frame_t *)buffer.bytes);
  if (-1 < local_4) {
    *(long *)(in_RDI + 0xe0) = (long)local_4 + *(long *)(in_RDI + 0xe0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int consume_one_frame(amqp_connection_state_t state, amqp_frame_t *decoded_frame)
{
  int res;

  amqp_bytes_t buffer;
  buffer.len = state->sock_inbound_limit - state->sock_inbound_offset;
  buffer.bytes = ((char *) state->sock_inbound_buffer.bytes) + state->sock_inbound_offset;

  res = amqp_handle_input(state, buffer, decoded_frame);
  if (res < 0) {
    return res;
  }

  state->sock_inbound_offset += res;

  return AMQP_STATUS_OK;
}